

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

void fill_derived_format_values(FMContext fmc,FMFormat_conflict format)

{
  int iVar1;
  FMdata_type FVar2;
  char *str;
  long in_RSI;
  undefined8 in_RDI;
  bool bVar3;
  FMFormat_conflict *subformats;
  FMTypeDesc *desc;
  FMFormat_conflict subformat;
  char *base_type_1;
  FMdata_type base_type;
  long elements;
  int field_size;
  int field;
  FMFieldList field_list;
  long *in_stack_000003e0;
  char *in_stack_000003e8;
  int in_stack_ffffffffffffffac;
  FMFieldList in_stack_ffffffffffffffb0;
  undefined8 *local_48;
  long local_40;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  FMFormat_conflict fmformat;
  
  *(undefined8 *)(in_RSI + 8) = in_RDI;
  *(undefined4 *)(in_RSI + 0x48) = 0;
  *(undefined4 *)(in_RSI + 0x4c) = 0;
  fmformat = *(FMFormat_conflict *)(in_RSI + 0x78);
  for (iVar4 = 0; iVar4 < *(int *)(in_RSI + 0x44); iVar4 = iVar4 + 1) {
    iVar1 = is_var_array_field(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (iVar1 == 1) {
      in_stack_ffffffffffffffe0 = *(undefined4 *)(in_RSI + 0x3c);
    }
    else {
      FVar2 = FMarray_str_to_data_type(in_stack_000003e8,in_stack_000003e0);
      if ((FVar2 != unknown_type) && (0x10 < *(int *)(&fmformat->format_name + (long)iVar4 * 3))) {
        fprintf(_stderr,
                "Field size for field %s in format %s is large, check to see if it is valid.\n",
                *(undefined8 *)(&fmformat->ref_count + (long)iVar4 * 6),
                *(undefined8 *)(in_RSI + 0x10));
      }
      in_stack_ffffffffffffffe0 = *(undefined4 *)(&fmformat->format_name + (long)iVar4 * 3);
    }
  }
  generate_var_list(fmformat,(FMFormat_conflict *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
  for (iVar4 = 0; iVar4 < *(int *)(in_RSI + 0x44); iVar4 = iVar4 + 1) {
    if (*(int *)(*(long *)(in_RSI + 0x80) + (long)iVar4 * 0x40) == 1) {
      *(undefined4 *)(in_RSI + 0x48) = 1;
    }
    else {
      str = base_data_type((char *)in_stack_ffffffffffffffb0);
      local_40 = 0;
      FVar2 = FMstr_to_data_type(str);
      if (FVar2 == unknown_type) {
        in_stack_ffffffffffffffb0 = *(FMFieldList *)(in_RSI + 0x70);
        while( true ) {
          bVar3 = false;
          if (in_stack_ffffffffffffffb0 != (FMFieldList)0x0) {
            bVar3 = in_stack_ffffffffffffffb0->field_name != (char *)0x0;
          }
          if (!bVar3) break;
          iVar1 = strcmp(str,*(char **)(in_stack_ffffffffffffffb0->field_name + 0x10));
          if (iVar1 == 0) {
            *(char **)(*(long *)(in_RSI + 0x88) + (long)iVar4 * 8) =
                 in_stack_ffffffffffffffb0->field_name;
          }
          in_stack_ffffffffffffffb0 = (FMFieldList)&in_stack_ffffffffffffffb0->field_type;
        }
        local_40 = *(long *)(*(long *)(in_RSI + 0x88) + (long)iVar4 * 8);
      }
      if (*(int *)(*(long *)(in_RSI + 0x80) + (long)iVar4 * 0x40 + 4) == 1) {
        *(undefined4 *)(in_RSI + 0x48) = 1;
      }
      else if (local_40 != 0) {
        *(uint *)(in_RSI + 0x48) = *(uint *)(local_40 + 0x48) | *(uint *)(in_RSI + 0x48);
      }
      for (local_48 = (undefined8 *)(*(long *)(in_RSI + 0x80) + (long)iVar4 * 0x40 + 0x20);
          local_48 != (undefined8 *)0x0; local_48 = (undefined8 *)*local_48) {
        if (*(int *)(local_48 + 1) == 0) {
          *(undefined4 *)(in_RSI + 0x48) = 1;
        }
      }
      free(str);
    }
  }
  return;
}

Assistant:

static void
fill_derived_format_values(FMContext fmc, FMFormat format)
{
    FMFieldList field_list;
    int field;
    format->context = fmc;
    format->variant = 0;
    format->recursive = 0;
    field_list = format->field_list;
    for (field = 0; field < format->field_count; field++) {
	int field_size = 0;
	if (is_var_array_field(field_list, field) == 1) {
	    /* variant array, real_field_size is format->pointer_size */
	    field_size = format->pointer_size;
	} else {
	    long elements = 1;
	    FMdata_type base_type;
	    base_type = FMarray_str_to_data_type(field_list[field].field_type,
					       &elements);
	    if ((base_type != unknown_type) &&
		(field_list[field].field_size > 16)) {
		fprintf(stderr, "Field size for field %s in format %s is large, check to see if it is valid.\n",
			field_list[field].field_name, format->format_name);
	    }
	    field_size = field_list[field].field_size * elements;
	}
	(void) field_size;
    }
    generate_var_list(format, format->subformats);
    for (field = 0; field < format->field_count; field++) {
	if (format->var_list[field].string == 1) {
	    format->variant = 1;
	} else {
	    char *base_type =
		base_data_type(field_list[field].field_type);
	    FMFormat subformat = NULL;
	    FMTypeDesc* desc = NULL;

	    /* if field is of another record format, fill that in */
	    if (FMstr_to_data_type(base_type) == unknown_type) {
	        FMFormat *subformats = format->subformats;
		while (subformats && subformats[0]) {
		    if (strcmp(base_type, subformats[0]->format_name) == 0) {
		    
		        format->field_subformats[field] = subformats[0];
		    }
		    subformats++;
		}
		subformat = format->field_subformats[field];
	    }
	    if (format->var_list[field].var_array == 1) {
		/* got a variant array */
		format->variant = 1;
	    } else {
		/* if field is variant by its subformat being variant */
		if (subformat != NULL) {
		    format->variant |= subformat->variant;
		}
	    }
	    desc = &format->var_list[field].type_desc;
	    while (desc != NULL) {
		if (desc->type == FMType_pointer) format->variant = 1;
		desc = desc->next;
	    }
	    free(base_type);
	}
    }
}